

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void determine_input_device(void)

{
  ulong uVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  reference pvVar8;
  value_type local_3b8 [32];
  stringstream local_398 [8];
  stringstream input_dev_path;
  ostream local_388 [380];
  int local_20c;
  ulong uStack_208;
  int index;
  size_type i;
  string line;
  undefined1 local_1e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  string local_1b8 [32];
  stringstream local_198 [8];
  stringstream output;
  char *cmd;
  
  setegid(0xfffe);
  seteuid(0xfffe);
  execute_abi_cxx11_((char *)local_1b8);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var3);
  std::__cxx11::string::~string(local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1e0);
  std::__cxx11::string::string((string *)&i);
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_198,(string *)&i);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    uStack_208 = std::__cxx11::string::find((char *)&i,0x10da25);
    if (uStack_208 != 0xffffffffffffffff) {
      uStack_208 = uStack_208 + 5;
    }
    uVar1 = uStack_208;
    uVar5 = std::__cxx11::string::size();
    if (uVar1 < uVar5) {
      lVar6 = std::__cxx11::string::c_str();
      local_20c = atoi((char *)(lVar6 + uStack_208));
      if (local_20c != -1) {
        std::__cxx11::stringstream::stringstream(local_398);
        std::operator<<(local_388,"/dev/input/");
        std::operator<<(local_388,"event");
        std::ostream::operator<<(local_388,local_20c);
        std::__cxx11::stringstream::str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1e0,local_3b8);
        std::__cxx11::string::~string((string *)local_3b8);
        std::__cxx11::stringstream::~stringstream(local_398);
      }
    }
  }
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1e0);
  if (sVar7 == 0) {
    error(0,0,"Couldn\'t determine keyboard device. :/");
    error(1,0,
          "Please post contents of your /proc/bus/input/devices file as a new bug report. Thanks!");
  }
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1e0,0);
  std::__cxx11::string::operator=((string *)&args.device,(string *)pvVar8);
  seteuid(0);
  setegid(0);
  std::__cxx11::string::~string((string *)&i);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void determine_input_device()
{
    // better be safe than sory: while running other programs, switch user to nobody
    setegid(65534); seteuid(65534);

    // extract input number from /proc/bus/input/devices (I don't know how to do it better. If you have an idea, please let me know.)
    // The compiler automatically concatenates these adjacent strings to a single string.
    const char* cmd = EXE_GREP " -E 'Handlers|EV=' /proc/bus/input/devices | "
                      EXE_GREP " -B1 'EV=1[02]001[3Ff]' | "
                      EXE_GREP " -Eo 'event[0-9]+' ";
    std::stringstream output(execute(cmd));

    std::vector<std::string> results;
    std::string line;

    while(std::getline(output, line)) {
        std::string::size_type i = line.find("event");
        if (i != std::string::npos) i += 5;                         // "event".size() == 5
        if (i < line.size()) {
            int index = atoi(&line.c_str()[i]);

            if (index != -1) {
                std::stringstream input_dev_path;
                input_dev_path << INPUT_EVENT_PATH;
                input_dev_path << "event";
                input_dev_path << index;

                results.push_back(input_dev_path.str());
            }
        }
    }

    if (results.size() == 0) {
        error(0, 0, "Couldn't determine keyboard device. :/");
        error(EXIT_FAILURE, 0, "Please post contents of your /proc/bus/input/devices file as a new bug report. Thanks!");
    }

    args.device = results[0];             // for now, use only the first found device

    // now we reclaim those root privileges
    seteuid(0); setegid(0);
}